

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_set_in_callback(Curl_easy *data,_Bool value)

{
  _Bool value_local;
  Curl_easy *data_local;
  
  if (data != (Curl_easy *)0x0) {
    if (data->multi_easy == (Curl_multi *)0x0) {
      if (data->multi != (Curl_multi *)0x0) {
        data->multi->in_callback = value;
      }
    }
    else {
      data->multi_easy->in_callback = value;
    }
  }
  return;
}

Assistant:

void Curl_set_in_callback(struct Curl_easy *data, bool value)
{
  /* might get called when there is no data pointer! */
  if(data) {
    if(data->multi_easy)
      data->multi_easy->in_callback = value;
    else if(data->multi)
      data->multi->in_callback = value;
  }
}